

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::JaroSimilarityFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffff9d4;
  undefined4 in_stack_fffffffffffff9dc;
  FunctionNullHandling in_stack_fffffffffffff9e8;
  bind_lambda_function_t in_stack_fffffffffffff9f0;
  code *local_600 [2];
  code *local_5f0;
  code *local_5e8;
  code *local_5e0 [2];
  code *local_5d0;
  code *local_5c8;
  LogicalType local_5c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_5a8;
  LogicalType local_590;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_578;
  LogicalType local_560;
  LogicalType local_548;
  LogicalType list_type;
  LogicalType local_518 [3];
  undefined1 local_4d0 [296];
  ScalarFunction fun;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType((LogicalType *)&fun,VARCHAR);
  LogicalType::LIST(&list_type,(LogicalType *)&fun);
  LogicalType::~LogicalType((LogicalType *)&fun);
  LogicalType::LogicalType((LogicalType *)local_4d0,VARCHAR);
  LogicalType::LogicalType((LogicalType *)(local_4d0 + 0x18),VARCHAR);
  __l._M_len = 2;
  __l._M_array = (iterator)local_4d0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_578,__l,(allocator_type *)local_518);
  LogicalType::LogicalType(&local_590,DOUBLE);
  local_5e0[1] = (code *)0x0;
  local_5e0[0] = JaroFunction;
  local_5c8 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_5d0 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_548,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_548;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff9d4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff9dc;
  ScalarFunction::ScalarFunction
            (&fun,(vector<duckdb::LogicalType,_true> *)&local_578,&local_590,
             (scalar_function_t *)local_5e0,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9f0);
  LogicalType::~LogicalType(&local_548);
  ::std::_Function_base::~_Function_base((_Function_base *)local_5e0);
  LogicalType::~LogicalType(&local_590);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_578);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_4d0 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ScalarFunction::ScalarFunction(&local_158,&fun);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  ScalarFunction::~ScalarFunction(&local_158);
  LogicalType::LogicalType(local_518,VARCHAR);
  LogicalType::LogicalType(local_518 + 1,VARCHAR);
  LogicalType::LogicalType(local_518 + 2,DOUBLE);
  __l_00._M_len = 3;
  __l_00._M_array = local_518;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_5a8,__l_00,(allocator_type *)&stack0xfffffffffffff9f7);
  LogicalType::LogicalType(&local_5c0,DOUBLE);
  local_600[1] = (code *)0x0;
  local_600[0] = JaroFunction;
  local_5e8 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_5f0 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_560,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_560;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff9d4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff9dc;
  ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_4d0,(vector<duckdb::LogicalType,_true> *)&local_5a8,&local_5c0,
             (scalar_function_t *)local_600,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_00,CONSISTENT,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9f0);
  ScalarFunction::operator=(&fun,(ScalarFunction *)local_4d0);
  ScalarFunction::~ScalarFunction((ScalarFunction *)local_4d0);
  LogicalType::~LogicalType(&local_560);
  ::std::_Function_base::~_Function_base((_Function_base *)local_600);
  LogicalType::~LogicalType(&local_5c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_5a8);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_518[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ScalarFunction::ScalarFunction(&local_280,&fun);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  ScalarFunction::~ScalarFunction(&fun);
  LogicalType::~LogicalType(&list_type);
  return in_RDI;
}

Assistant:

ScalarFunctionSet JaroSimilarityFun::GetFunctions() {
	ScalarFunctionSet jaro;

	const auto list_type = LogicalType::LIST(LogicalType::VARCHAR);
	auto fun = ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::DOUBLE, JaroFunction);
	jaro.AddFunction(fun);

	fun = ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                     JaroFunction);
	jaro.AddFunction(fun);
	return jaro;
}